

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O3

void gimage::gauss<float>(Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  float *pfVar2;
  float **ppfVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  float ***pppfVar7;
  long lVar8;
  long lVar9;
  float **ppfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  GaussKernel kernel;
  ImageFloat tmp;
  GaussKernel local_c8;
  float **local_b0;
  float ***local_a8;
  Image<float,_gimage::PixelTraits<float>_> *local_a0;
  float ***local_98;
  float ***local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_c8.kernel = (float *)0x0;
  local_c8.kn = 0;
  local_c8.kn2 = 0;
  GaussKernel::set(&local_c8,s);
  lVar6 = image->height;
  if (image->height < image->width) {
    lVar6 = image->width;
  }
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,lVar6,1,1);
  local_80 = (long)image->depth;
  if (0 < local_80) {
    pfVar1 = **local_68.img;
    lVar6 = image->width;
    local_88 = image->height;
    local_90 = image->img;
    local_78 = lVar6 * 4;
    lVar11 = 0;
    do {
      if (0 < local_88) {
        local_b0 = local_90[lVar11];
        local_a8 = (float ***)-(ulong)(uint)local_c8.kn2;
        lVar12 = 0;
        do {
          if (0 < lVar6) {
            local_98 = image->img;
            lVar13 = 0;
            pppfVar7 = local_a8;
            do {
              if (lVar13 < lVar6 - local_c8.kn2 && local_c8.kn2 <= lVar13) {
                if (local_c8.kn < 1) {
                  fVar14 = 0.0;
                }
                else {
                  fVar14 = 0.0;
                  lVar8 = 0;
                  do {
                    fVar14 = fVar14 + local_c8.kernel[lVar8] *
                                      local_98[lVar11][lVar12][(int)pppfVar7 + lVar8];
                    lVar8 = lVar8 + 1;
                  } while (local_c8.kn != lVar8);
                }
              }
              else {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar8 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar5 = (int)pppfVar7 + (int)lVar8;
                    if ((-1 < (int)uVar5) &&
                       (uVar4 = (ulong)(uVar5 & 0x7fffffff), (long)uVar4 < lVar6)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar8];
                      fVar14 = fVar14 + local_c8.kernel[lVar8] * image->img[lVar11][lVar12][uVar4];
                    }
                    lVar8 = lVar8 + 1;
                  } while (local_c8.kn != lVar8);
                  fVar14 = fVar14 / fVar15;
                }
              }
              pfVar1[lVar13] = fVar14;
              lVar13 = lVar13 + 1;
              pppfVar7 = (float ***)((long)pppfVar7 + 1);
            } while (lVar13 != lVar6);
            if (0 < lVar6) {
              pfVar2 = local_b0[lVar12];
              lVar13 = 0;
              do {
                pfVar2[lVar13] = pfVar1[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar6 != lVar13);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != local_88);
      }
      if (0 < lVar6) {
        local_98 = (float ***)(long)local_c8.kn2;
        ppfVar10 = (float **)*local_90[lVar11];
        local_70 = -(ulong)(uint)local_c8.kn2;
        lVar12 = 0;
        do {
          if (0 < local_88) {
            local_a8 = image->img;
            lVar8 = 0;
            lVar13 = local_70;
            do {
              if (lVar8 < local_88 - (long)local_98 && (long)local_98 <= lVar8) {
                if (local_c8.kn < 1) {
                  fVar14 = 0.0;
                }
                else {
                  fVar14 = 0.0;
                  lVar9 = 0;
                  do {
                    fVar14 = fVar14 + local_c8.kernel[lVar9] *
                                      local_a8[lVar11][(int)lVar13 + lVar9][lVar12];
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                }
              }
              else {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar9 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar5 = (int)lVar13 + (int)lVar9;
                    if ((-1 < (int)uVar5) &&
                       (uVar4 = (ulong)(uVar5 & 0x7fffffff), (long)uVar4 < image->height)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar9];
                      fVar14 = fVar14 + local_c8.kernel[lVar9] * image->img[lVar11][uVar4][lVar12];
                    }
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                  fVar14 = fVar14 / fVar15;
                }
              }
              pfVar1[lVar8] = fVar14;
              lVar8 = lVar8 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar8 != local_88);
            local_b0 = ppfVar10;
            if (0 < local_88) {
              lVar13 = 0;
              ppfVar3 = ppfVar10;
              do {
                *(float *)ppfVar3 = pfVar1[lVar13];
                lVar13 = lVar13 + 1;
                ppfVar3 = (float **)((long)ppfVar3 + local_78);
              } while (local_88 != lVar13);
            }
          }
          lVar12 = lVar12 + 1;
          ppfVar10 = (float **)((long)ppfVar10 + 4);
        } while (lVar12 != lVar6);
      }
      lVar11 = lVar11 + 1;
      local_a0 = image;
    } while (lVar11 != local_80);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  if (local_c8.kernel != (float *)0x0) {
    operator_delete__(local_c8.kernel);
  }
  return;
}

Assistant:

void gauss(Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(std::max(image.getWidth(), image.getHeight()), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal in place

    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        p[i]=kernel.convolveHorizontal(image, i, k, d);
      }

      T *tp=image.getPtr(0, k, d);
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(p[i]);
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(image, i, k, d);
      }

      T *tp=image.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=image.getWidth();
      }
    }
  }
}